

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::findRegexMatch
          (CoreBroker *this,string *target,InterfaceType type,GlobalHandle handle,uint16_t flags)

{
  ushort uVar1;
  bool bVar2;
  InterfaceType IVar3;
  uint16_t uVar4;
  BasicHandleInfo *pBVar5;
  InterfaceType in_DL;
  ushort in_R8W;
  invalid_argument *ia;
  uint16_t destFlags;
  BasicHandleInfo *hnd;
  GlobalHandle *mtch;
  iterator __end2;
  iterator __begin2;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range2;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> matches;
  BasicHandleInfo *dest;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *in_stack_fffffffffffffd68;
  uint in_stack_fffffffffffffd70;
  undefined2 in_stack_fffffffffffffd74;
  undefined1 in_stack_fffffffffffffd76;
  InterfaceType in_stack_fffffffffffffd77;
  BasicHandleInfo *in_stack_fffffffffffffd78;
  GlobalHandle in_stack_fffffffffffffd80;
  GlobalHandle in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd98;
  InterfaceType in_stack_fffffffffffffd99;
  InterfaceType in_stack_fffffffffffffd9a;
  InterfaceType in_stack_fffffffffffffd9b;
  uint in_stack_fffffffffffffd9c;
  action_t in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  InterfaceType in_stack_fffffffffffffe3f;
  string *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  uint32_t in_stack_fffffffffffffecc;
  BasicHandleInfo *in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffedc;
  BasicHandleInfo *in_stack_fffffffffffffee0;
  CoreBroker *in_stack_fffffffffffffee8;
  pair<helics::action_message_def::action_t,_helics::action_message_def::action_t>
  in_stack_fffffffffffffef0;
  ushort local_102;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  local_e0;
  undefined1 *local_d8;
  undefined1 local_c0 [32];
  BasicHandleInfo *local_a0;
  ushort local_94;
  InterfaceType local_91;
  
  local_94 = in_R8W;
  local_91 = in_DL;
  local_a0 = HandleManager::findHandle
                       ((HandleManager *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
  HandleManager::regexSearch
            ((HandleManager *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f);
  local_d8 = local_c0;
  local_e0._M_current =
       (GlobalHandle *)
       std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                 (in_stack_fffffffffffffd68);
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
            (in_stack_fffffffffffffd68);
  while (bVar2 = __gnu_cxx::
                 operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                           ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd77,
                                        CONCAT16(in_stack_fffffffffffffd76,
                                                 CONCAT24(in_stack_fffffffffffffd74,
                                                          in_stack_fffffffffffffd70))),
                            (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                             *)in_stack_fffffffffffffd68), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
    ::operator*(&local_e0);
    pBVar5 = HandleManager::findHandle
                       ((HandleManager *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd88);
    uVar1 = local_94;
    if (pBVar5 != (BasicHandleInfo *)0x0) {
      local_102 = local_94;
      if (((local_a0 != (BasicHandleInfo *)0x0) && (local_a0->handleType == FILTER)) &&
         (bVar2 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>
                            ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                              *)local_a0,clone_flag), bVar2)) {
        local_102 = make_flags(9);
        local_102 = uVar1 | local_102;
        uVar4 = make_flags(9);
        local_94 = local_94 | uVar4;
      }
      if ((local_91 == ENDPOINT) &&
         ((local_a0 == (BasicHandleInfo *)0x0 || (local_a0->handleType != FILTER)))) {
        local_102 = toggle_flag(CONCAT11(in_stack_fffffffffffffd77,in_stack_fffffffffffffd76),
                                in_stack_fffffffffffffd70);
      }
      if (local_a0 == (BasicHandleInfo *)0x0) {
        IVar3 = getMatchType(local_91);
        in_stack_fffffffffffffda4 = CONCAT13(IVar3,(int3)in_stack_fffffffffffffda4);
        BasicHandleInfo::BasicHandleInfo
                  (in_stack_fffffffffffffd78,in_stack_fffffffffffffd80,in_stack_fffffffffffffd77);
      }
      else {
        BasicHandleInfo::BasicHandleInfo
                  ((BasicHandleInfo *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (BasicHandleInfo *)
                   CONCAT44(in_stack_fffffffffffffd9c,
                            CONCAT13(in_stack_fffffffffffffd9b,
                                     CONCAT12(in_stack_fffffffffffffd9a,
                                              CONCAT11(in_stack_fffffffffffffd99,
                                                       in_stack_fffffffffffffd98)))));
      }
      in_stack_fffffffffffffd9c = (uint)local_102;
      in_stack_fffffffffffffda0 = getAction(local_91);
      in_stack_fffffffffffffd9b = local_91;
      if (local_a0 == (BasicHandleInfo *)0x0) {
        in_stack_fffffffffffffd99 = getMatchType(local_91);
        in_stack_fffffffffffffd9a = in_stack_fffffffffffffd99;
      }
      else {
        in_stack_fffffffffffffd9a = local_a0->handleType;
      }
      getMatchAction(in_stack_fffffffffffffd9b,in_stack_fffffffffffffd9a);
      in_stack_fffffffffffffd88 =
           (GlobalHandle)
           std::make_pair<helics::action_message_def::action_t,helics::action_message_def::action_t>
                     ((action_t *)in_stack_fffffffffffffd68,(action_t *)0x5e8404);
      connectInterfaces(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffedc,in_stack_fffffffffffffed0,
                        in_stack_fffffffffffffecc,in_stack_fffffffffffffef0);
      BasicHandleInfo::~BasicHandleInfo
                ((BasicHandleInfo *)
                 CONCAT17(in_stack_fffffffffffffd77,
                          CONCAT16(in_stack_fffffffffffffd76,
                                   CONCAT24(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70))));
    }
    __gnu_cxx::
    __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
    ::operator++(&local_e0);
  }
  std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::~vector
            ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
             in_stack_fffffffffffffd80);
  return;
}

Assistant:

void CoreBroker::findRegexMatch(const std::string& target,
                                InterfaceType type,
                                GlobalHandle handle,
                                uint16_t flags)
{
    const auto* dest = handles.findHandle(handle);

    try {
        auto matches = handles.regexSearch(target, type);
        for (auto& mtch : matches) {
            const auto* hnd = handles.findHandle(mtch);
            if (hnd == nullptr) {
                continue;
            }
            auto destFlags = flags;
            if (dest != nullptr && dest->handleType == InterfaceType::FILTER) {
                if (checkActionFlag(*dest, clone_flag)) {
                    destFlags |= make_flags(clone_flag);
                    flags |= make_flags(clone_flag);
                }
            }
            if (type == InterfaceType::ENDPOINT &&
                (dest == nullptr || dest->handleType != InterfaceType::FILTER)) {
                destFlags = toggle_flag(destFlags, destination_target);
            }
            connectInterfaces(*hnd,
                              flags,
                              (dest != nullptr) ? *dest :
                                                  BasicHandleInfo(handle, getMatchType(type)),

                              destFlags,
                              std::make_pair(getAction(type),
                                             getMatchAction(type,
                                                            (dest != nullptr) ?
                                                                dest->handleType :
                                                                getMatchType(type))));
        }
    }
    catch (const std::invalid_argument& ia) {
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    fmt::format("invalid regular expression processing {}", ia.what()));
    }
}